

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::Write3dmGoo(ON_BinaryArchive *this,ON_3dmGoo *goo)

{
  bool bVar1;
  bool local_19;
  bool savedDoCRC;
  bool rc;
  ON_3dmGoo *goo_local;
  ON_BinaryArchive *this_local;
  
  local_19 = false;
  if (goo->m_typecode != 0) {
    bVar1 = this->m_bDoChunkCRC;
    this->m_bDoChunkCRC = false;
    if ((goo->m_typecode & 0x80000000) == 0) {
      local_19 = WriteInt(this,goo->m_typecode);
      if (local_19) {
        local_19 = WriteInt(this,goo->m_value);
      }
    }
    else if ((goo->m_value == 0) || ((0 < goo->m_value && (goo->m_goo != (uchar *)0x0)))) {
      local_19 = WriteInt(this,goo->m_typecode);
      if (local_19) {
        local_19 = WriteInt(this,goo->m_value);
      }
      if ((local_19 != false) && (0 < goo->m_value)) {
        local_19 = WriteByte(this,(long)goo->m_value,goo->m_goo);
      }
    }
    this->m_bDoChunkCRC = (bool)(bVar1 & 1);
  }
  return local_19;
}

Assistant:

bool ON_BinaryArchive::Write3dmGoo( const ON_3dmGoo& goo )
{
  bool rc = false;

  if ( goo.m_typecode ) {
    const bool savedDoCRC = m_bDoChunkCRC;
    m_bDoChunkCRC = false;
    if ( 0 != (goo.m_typecode & TCODE_SHORT) ) {
      if ( goo.m_value == 0 || (goo.m_value > 0 && goo.m_goo) ) {
        // write long chunk - do not use Begin/EndWrite3dmChunk() because
        //                    goo may contain subchunks and CRC would be
        //                    incorrectly computed.
        rc = WriteInt( goo.m_typecode );
        if (rc) rc = WriteInt( goo.m_value );
        if (rc && goo.m_value>0) rc = WriteByte( goo.m_value, goo.m_goo );
      }
    }
    else {
      // write short chunk
      rc = WriteInt( goo.m_typecode );
      if (rc) rc = WriteInt( goo.m_value );
    }
    m_bDoChunkCRC = savedDoCRC;
  }
  
  return rc;
}